

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Announcements.cpp
# Opt level: O2

bool __thiscall RenX_AnnouncementsPlugin::initialize(RenX_AnnouncementsPlugin *this)

{
  undefined1 *this_00;
  bool bVar1;
  long lVar2;
  longlong lVar3;
  Timer *pTVar4;
  long lVar5;
  string_view in_key;
  string_view in_key_00;
  string_view in_key_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->field_0x38;
  in_key._M_str = "Random";
  in_key._M_len = 6;
  bVar1 = Jupiter::Config::get<bool>((Config *)this_00,in_key,false);
  this->random = bVar1;
  s_abi_cxx11_(&local_48,"Announcements.txt",0x11);
  in_key_01._M_str = "File";
  in_key_01._M_len = 4;
  Jupiter::Config::get<std::__cxx11::string>(&bStack_68,(Config *)this_00,in_key_01,&local_48);
  Jupiter::File::load(&this->announcementsFile,&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = Jupiter::File::getLineCount();
  if (lVar2 == 0) {
    fputs("[RenX.Announcements] ERROR: No announcements loaded.\r\n",_stderr);
  }
  else {
    in_key_00._M_str = "Delay";
    in_key_00._M_len = 5;
    lVar3 = Jupiter::Config::get<long_long>((Config *)this_00,in_key_00,0x3c);
    pTVar4 = (Timer *)operator_new(0x30);
    Jupiter::Timer::Timer(pTVar4,0,lVar3 * 1000,announce_,0);
    this->timer = pTVar4;
    if (this->random == false) {
      lVar5 = Jupiter::File::getLineCount();
      this->lastLine = lVar5 - 1;
    }
  }
  return lVar2 != 0;
}

Assistant:

bool RenX_AnnouncementsPlugin::initialize()
{
	RenX_AnnouncementsPlugin::random = this->config.get<bool>("Random"sv);

	RenX_AnnouncementsPlugin::announcementsFile.load(this->config.get("File"sv, "Announcements.txt"s));
	if (RenX_AnnouncementsPlugin::announcementsFile.getLineCount() == 0)
	{
		fputs("[RenX.Announcements] ERROR: No announcements loaded." ENDL, stderr);
		return false;
	}
	std::chrono::milliseconds delay = std::chrono::seconds(this->config.get<long long>("Delay"sv, 60));
	RenX_AnnouncementsPlugin::timer = new Jupiter::Timer(0, delay, announce_);
	if (RenX_AnnouncementsPlugin::random == false)
		RenX_AnnouncementsPlugin::lastLine = RenX_AnnouncementsPlugin::announcementsFile.getLineCount() - 1;
	return true;
}